

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.hpp
# Opt level: O1

void __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::~ElectronOptimisationAlgorithm
          (ElectronOptimisationAlgorithm *this)

{
  pointer puVar1;
  
  this->_vptr_ElectronOptimisationAlgorithm =
       (_func_int **)&PTR__ElectronOptimisationAlgorithm_00143790;
  puVar1 = (this->previousDist_).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->previousDist_).m_bits.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::
  _Rb_tree<std::pair<void_*,_void_*>,_std::pair<const_std::pair<void_*,_void_*>,_void_*>,_std::_Select1st<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
  ::~_Rb_tree(&(this->mvp2ev_)._M_t);
  std::
  vector<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
  ::~vector(&this->minDistributions_);
  return;
}

Assistant:

virtual ~ElectronOptimisationAlgorithm() {}